

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O3

Atom getSupportedAtom(Atom *supportedAtoms,unsigned_long atomCount,char *atomName)

{
  Atom AVar1;
  unsigned_long uVar2;
  
  AVar1 = XInternAtom(_glfw.x11.display,atomName,1);
  if (atomCount != 0 && AVar1 != 0) {
    uVar2 = 0;
    do {
      if (supportedAtoms[uVar2] == AVar1) {
        return AVar1;
      }
      uVar2 = uVar2 + 1;
    } while (atomCount != uVar2);
  }
  return 0;
}

Assistant:

static Atom getSupportedAtom(Atom* supportedAtoms,
                             unsigned long atomCount,
                             const char* atomName)
{
    Atom atom = XInternAtom(_glfw.x11.display, atomName, True);
    if (atom != None)
    {
        unsigned long i;

        for (i = 0;  i < atomCount;  i++)
        {
            if (supportedAtoms[i] == atom)
                return atom;
        }
    }

    return None;
}